

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void __thiscall
GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Reset
          (GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *this)

{
  ChunkedStackPool<65532> *pCVar1;
  StackChunk *pSVar2;
  ulong uVar3;
  
  this->total = 0;
  pCVar1 = this->pool;
  pSVar2 = pCVar1->first;
  while (pSVar2 != (StackChunk *)0x0) {
    pSVar2 = pSVar2->next;
    (*(code *)NULLC::dealloc)();
    pCVar1->first = pSVar2;
  }
  pCVar1->first = (StackChunk *)0x0;
  pCVar1->curr = (StackChunk *)0x0;
  pCVar1->size = 0xfffc;
  if ((this->largeObjects).count != 0) {
    uVar3 = 0;
    do {
      (*(code *)NULLC::dealloc)((this->largeObjects).data[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->largeObjects).count);
  }
  if ((this->largeObjects).data != (void **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  (this->largeObjects).data = (void **)0x0;
  (this->largeObjects).max = 0;
  (this->largeObjects).count = 0;
  return;
}

Assistant:

void Reset()
	{
		total = 0;

		pool.Reset();

		for(unsigned i = 0; i < largeObjects.count; i++)
			NULLC::dealloc(largeObjects.data[i]);
		largeObjects.reset();
	}